

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O2

PTR __thiscall brynet::net::TcpService::getRandomEventLoop(TcpService *this)

{
  long lVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  PTR PVar3;
  
  this->_vptr_TcpService = (_func_int **)0x0;
  (this->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  iVar2 = rand();
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x30))->__data);
  lVar1 = *(long *)(in_RSI + 0x18);
  if (lVar1 != *(long *)(in_RSI + 0x20)) {
    std::__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)(lVar1 + ((ulong)(long)iVar2 %
                                  (ulong)(*(long *)(in_RSI + 0x20) - lVar1 >> 4)) * 0x10) + 0x10));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x30));
  PVar3.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PTR)PVar3.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

EventLoop::PTR TcpService::getRandomEventLoop()
{
    EventLoop::PTR ret;
    {
        auto randNum = rand();
        std::lock_guard<std::mutex> lock(mIOLoopGuard);
        if (!mIOLoopDatas.empty())
        {
            ret = mIOLoopDatas[randNum % mIOLoopDatas.size()]->getEventLoop();
        }
    }

    return ret;
}